

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

MapcodeError decoderEngine(DecodeRec *dec,int parseFlags)

{
  char *__s;
  Point *pPVar1;
  undefined1 uVar2;
  byte bVar3;
  Territory TVar4;
  uint uVar5;
  uint maxLon32;
  bool bVar6;
  MapcodeError MVar7;
  int iVar8;
  uint uVar9;
  Territory TVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  char *pcVar18;
  Territory TVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  MapcodeZone *pMVar24;
  byte *pbVar25;
  Point32 PVar26;
  TerritoryBoundary *pTVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int *piVar31;
  int *piVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  MapcodeZone z;
  char input [8];
  int GOODROUNDER;
  MapcodeError local_fc;
  int local_e8;
  MapcodeZone local_d8;
  undefined4 local_ac;
  int local_a8;
  uint local_a4;
  undefined4 local_a0;
  long local_98;
  MapcodeZone *local_90;
  char *local_88;
  TerritoryBoundary *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  TerritoryBoundary *local_58;
  TerritoryBoundary *local_50;
  Point32 *local_48;
  undefined8 local_40;
  long local_38;
  
  uVar21 = (ulong)(uint)dec->context;
  MVar7 = parseMapcodeString(&dec->mapcodeElements,dec->orginput,parseFlags,dec->context);
  if (MVar7 != ERR_OK) {
    (dec->mapcodeElements).territoryISO[0] = '\0';
    (dec->mapcodeElements).properMapcode[0] = '\0';
    (dec->mapcodeElements).precisionExtension[0] = '\0';
    return MVar7;
  }
  TVar4 = (dec->mapcodeElements).territoryCode;
  iVar11 = (dec->mapcodeElements).indexOfDot;
  dec->context = TVar4;
  __s = (dec->mapcodeElements).properMapcode;
  dec->mapcode = __s;
  dec->extension = (dec->mapcodeElements).precisionExtension;
  sVar17 = strlen(__s);
  pcVar18 = strchr(__s,0x41);
  if (((pcVar18 == (char *)0x0) && (pcVar18 = strchr(__s,0x45), pcVar18 == (char *)0x0)) &&
     (pcVar18 = strchr(__s,0x55), pcVar18 == (char *)0x0)) {
    local_ac = (undefined4)CONCAT71((int7)(uVar21 >> 8),1);
  }
  else {
    iVar8 = unpackIfAllDigits(__s);
    if (iVar8 < 1) {
      return ERR_INVALID_VOWEL;
    }
    local_ac = 0;
  }
  iVar11 = iVar11 * 9;
  iVar8 = iVar11 + (int)sVar17;
  if (0x37 < iVar8) {
    return ERR_MAPCODE_UNDECODABLE;
  }
  uVar9 = (iVar11 + (int)sVar17) - 1;
  TVar19 = TERRITORY_AAA;
  if (uVar9 == 0x36) goto LAB_001cecca;
  if (TVar4 < _TERRITORY_MIN) {
    return ERR_MISSING_TERRITORY;
  }
  TVar19 = TVar4;
  if (((uint)(TVar4 + ~TERRITORY_AAA) < 0xfffffdeb) || (""[(uint)(TVar4 + ~_TERRITORY_MIN)] == '\0')
     ) goto LAB_001cecca;
  TVar10 = TERRITORY_NONE;
  if (0xfffffdea < (uint)(TVar4 + ~TERRITORY_AAA)) {
    TVar10 = PARENT_NR[""[(uint)(TVar4 + ~_TERRITORY_MIN)]];
  }
  if (iVar8 == 0x23) {
LAB_001ceca8:
    if ((TVar10 & 0xfffffffb) != TERRITORY_IND) goto LAB_001cecca;
  }
  else if (iVar8 != 0x2d) {
    if (iVar8 != 0x2c) goto LAB_001cecca;
    goto LAB_001ceca8;
  }
  TVar19 = TVar10;
LAB_001cecca:
  lVar22 = (long)*(int *)("" + (long)TVar19 * 4 + 0x28c);
  local_38 = (long)*(int *)("" + (long)TVar19 * 4 + 0x290);
  local_98 = local_38 + -1;
  MVar7 = ERR_MAPCODE_UNDECODABLE;
  if (*(int *)("" + (long)TVar19 * 4 + 0x28c) < *(int *)("" + (long)TVar19 * 4 + 0x290)) {
    local_90 = &dec->zone;
    local_50 = TERRITORY_BOUNDARIES + local_98;
    local_48 = &dec->coord32;
    local_80 = (TerritoryBoundary *)((long)MAX_ERROR_IN_METERS + lVar22 * 0x14 + 0x3c);
    local_58 = TERRITORY_BOUNDARIES + lVar22;
    piVar31 = &TERRITORY_BOUNDARIES[lVar22].flags;
    local_e8 = 0;
    lVar34 = lVar22;
    do {
      uVar5 = TERRITORY_BOUNDARIES[lVar34].flags;
      iVar11 = (uVar5 & 0x1f) + ((uVar5 & 0x1f) / 5) * 5;
      uVar29 = iVar11 + 1;
      uVar12 = uVar5 >> 7 & 3;
      iVar28 = (int)lVar34;
      if (uVar12 == 1) {
        if ((iVar8 != iVar11 + 0xc) ||
           ("0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar5 >> 0xb & 0x1f] != *__s)) {
LAB_001cef61:
          bVar35 = false;
          goto LAB_001cf823;
        }
        MVar7 = decodeGrid(dec,iVar28,1);
LAB_001cf3db:
        bVar35 = true;
      }
      else {
        if (uVar12 != 0) {
          if ((uVar29 != 0x16 || uVar9 != 0x17) && (uVar29 != 0x17 || uVar9 != 0x21))
          goto LAB_001cef61;
          pbVar25 = (byte *)dec->mapcode;
          local_88 = strchr((char *)pbVar25,0x2e);
          if (local_88 == (char *)0x0) {
            MVar7 = ERR_DOT_MISSING;
            local_88 = (char *)0x0;
            goto LAB_001cf81e;
          }
          iVar11 = 0;
          while( true ) {
            bVar3 = *pbVar25;
            if ((bVar3 == 0) || (bVar3 == 0x2e)) break;
            pbVar25 = pbVar25 + 1;
            iVar11 = (int)(char)decodeChar_decode_chars[bVar3] + iVar11 * 0x1f;
          }
          iVar11 = iVar11 * 0x745f;
          local_40 = 0xe1781;
          if (0x16 < uVar29) {
            local_40 = 0x1b4d89f;
          }
          local_88 = local_88 + 1;
          iVar28 = 0;
          piVar32 = piVar31;
          do {
            MVar7 = ERR_MAPCODE_UNDECODABLE;
            if (((*piVar32 & 0x1fU) + ((*piVar32 & 0x1fU) / 5) * 5 + 1 != uVar29) ||
               (((uint)*piVar32 >> 8 & 1) == 0)) break;
            uVar5 = piVar32[-3];
            uVar12 = piVar32[-1];
            uVar13 = uVar5;
            if ((int)uVar5 < 0) {
              iVar16 = 0x168;
              if ((int)uVar12 < 0) {
                uVar13 = -uVar12;
                goto LAB_001cf091;
              }
            }
            else {
LAB_001cf091:
              iVar16 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar13 >> 0x13) * 4);
            }
            iVar20 = uVar12 - uVar5;
            iVar14 = (int)((ulong)((long)(iVar20 + 0x59) * -0x49f49f49) >> 0x20) + iVar20 + 0x59;
            uVar13 = ((TerritoryBoundary *)(piVar32 + -4))->minx;
            maxLon32 = piVar32[-2];
            iVar23 = maxLon32 - uVar13;
            iVar14 = (((iVar14 >> 6) - (iVar14 >> 0x1f)) + 0xaf) / 0xb0;
            iVar16 = ((iVar16 + iVar23 * 4 + -1) / iVar16 + 0xa7) / 0xa8;
            iVar30 = iVar14 * iVar16 * 0x745f;
            if ((*piVar32 & 0x180U) == 0x100) {
              iVar30 = iVar30 + iVar28 + (int)local_40 + -1;
              iVar30 = iVar30 - (iVar30 % (int)local_40 + iVar28);
            }
            bVar35 = iVar11 < iVar28;
            iVar30 = iVar30 + iVar28;
            bVar6 = iVar30 <= iVar11;
            if (!bVar6 && !bVar35) {
              iVar16 = iVar16 * 0xa8;
              local_a8 = (iVar23 + iVar16 + -1) / iVar16;
              iVar23 = (iVar20 + iVar14 * 0xb0 + -1) / (iVar14 * 0xb0);
              iVar11 = (iVar11 - iVar28) / 0x745f;
              local_a4 = uVar12;
              decodeTriple(local_88,(int *)&local_d8,&local_a0);
              iVar16 = ((iVar11 % iVar14) * 0xb0 + local_a0) * iVar23;
              iVar20 = local_a4 - iVar16;
              (dec->coord32).latMicroDeg = iVar20;
              iVar30 = ((iVar11 / iVar14) * 0xa8 + local_d8.fminy._0_4_) * local_a8;
              iVar14 = uVar13 + iVar30;
              (dec->coord32).lonMicroDeg = iVar14;
              bVar36 = false;
              MVar7 = ERR_MAPCODE_UNDECODABLE;
              if (((-1 < iVar30) && (iVar14 < (int)maxLon32)) &&
                 (bVar36 = false, (int)uVar5 <= iVar20)) {
                bVar36 = -1 < iVar16;
                MVar7 = local_fc;
                if (!bVar36) {
                  MVar7 = ERR_MAPCODE_UNDECODABLE;
                }
              }
              local_fc = MVar7;
              iVar30 = iVar28;
              if (bVar36) {
                local_fc = decodeExtension(dec,local_a8 << 2,-iVar23,0,uVar5,maxLon32);
              }
            }
            iVar28 = iVar30;
            piVar32 = piVar32 + 5;
            MVar7 = local_fc;
          } while (bVar6 || bVar35);
          goto LAB_001cf3db;
        }
        if ((uVar5 & 0x40) == 0) {
          if ((uVar29 != uVar9) && (uVar29 != 0x15 || uVar9 != 0x16)) goto LAB_001cef61;
          MVar7 = decodeGrid(dec,iVar28,0);
          restrictZoneTo(local_90,local_90,local_50);
          if ((MVar7 != ERR_OK) || (MVar7 = ERR_OK, (uVar5 >> 9 & 1) == 0)) goto LAB_001cf81e;
          dVar38 = (dec->zone).fminy;
          dVar37 = floor(((dec->zone).fminx + (dec->zone).fmaxx) * 0.5);
          dVar38 = floor((dVar38 + (dec->zone).fmaxy) * 0.5);
          (dec->result).lat = dVar38;
          (dec->result).lon = dVar37;
          dVar38 = floor(dVar38 / 810000.0);
          PVar26.latMicroDeg = (int)dVar38;
          dVar38 = floor(dVar37 / 3240000.0);
          PVar26.lonMicroDeg = (int)dVar38;
          dec->coord32 = PVar26;
          pTVar27 = local_80;
          for (lVar33 = lVar34; lVar22 < lVar33; lVar33 = lVar33 + -1) {
            if (((pTVar27->flags & 0x200) == 0) &&
               (iVar11 = fitsInsideBoundaries(local_48,pTVar27), iVar11 != 0)) goto LAB_001cf3db;
            pTVar27 = pTVar27 + -1;
          }
          iVar11 = 0;
          if (lVar22 < lVar34) {
            iVar11 = 0;
            pTVar27 = local_58;
            iVar28 = local_e8;
            do {
              if ((pTVar27->flags & 0x200) == 0) {
                iVar16 = restrictZoneTo(&local_d8,local_90,pTVar27);
                bVar35 = true;
                if (iVar16 != 0) {
                  if (iVar11 == 0) {
                    local_60 = (double)CONCAT44(local_d8.fminy._4_4_,local_d8.fminy._0_4_);
                    local_68 = local_d8.fmaxy;
                    local_70 = local_d8.fminx;
                    iVar11 = 1;
                    local_78 = local_d8.fmaxx;
                  }
                  else {
                    iVar11 = iVar11 + 1;
                    bVar35 = false;
                  }
                }
                if (!bVar35) break;
              }
              pTVar27 = pTVar27 + 1;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          bVar35 = true;
          if (iVar11 == 1) {
            (dec->zone).fminy = local_60;
            (dec->zone).fmaxy = local_68;
            (dec->zone).fminx = local_70;
            (dec->zone).fmaxx = local_78;
          }
          MVar7 = ERR_OK;
          if (iVar11 == 0) {
            MVar7 = ERR_MAPCODE_UNDECODABLE;
          }
        }
        else if (((uVar29 == 0x15 && uVar9 == 0x16) || (uVar9 == 0x20 && (uVar29 ^ 0x16) == 0)) ||
                (uVar29 == 0xd && uVar9 == 0x17)) {
          pcVar18 = dec->mapcode;
          sVar17 = strlen(pcVar18);
          iVar11 = (int)sVar17;
          MVar7 = ERR_BAD_MAPCODE_LENGTH;
          if (0xfffffffd < iVar11 - 7U) {
            bVar35 = uVar29 == 0x16;
            strcpy((char *)&local_a0,pcVar18);
            strcpy((char *)((long)&local_a0 + (ulong)bVar35 + 2),pcVar18 + (ulong)bVar35 + 3);
            iVar16 = *(int *)("" + (long)dec->context * 4 + 0x28c);
            iVar14 = countNamelessRecords(iVar28,iVar16);
            iVar16 = firstNamelessRecord(iVar28,iVar16);
            strcpy((char *)&local_d8,(char *)&local_a0);
            iVar30 = (int)(0x1f / (long)iVar14);
            iVar28 = (int)(0x1f % (long)iVar14);
            if (0x1f < iVar14 || uVar29 == 0x15) {
              if ((uVar29 == 0x15) || (0x3d < iVar14)) {
                lVar33 = 0x1b4d89f;
                if (uVar29 == 0x15) {
                  lVar33 = 0xe1781;
                }
                iVar20 = (int)(lVar33 / (long)iVar14);
                if (iVar14 == 0x3e) {
                  iVar20 = iVar20 + 1;
                }
                else {
                  iVar20 = (iVar20 / 0x3c1) * 0x3c1;
                }
                iVar23 = 0;
                pMVar24 = &local_d8;
                while( true ) {
                  bVar3 = *(byte *)&pMVar24->fminy;
                  if ((bVar3 == 0) || (bVar3 == 0x2e)) break;
                  pMVar24 = (MapcodeZone *)((long)&pMVar24->fminy + 1);
                  iVar23 = (int)(char)decodeChar_decode_chars[bVar3] + iVar23 * 0x1f;
                }
                iVar15 = iVar23 / iVar20;
                iVar23 = iVar23 % iVar20;
                bVar35 = false;
              }
              else {
                iVar15 = (int)(char)decodeChar_decode_chars[local_d8.fminy._0_1_];
                iVar23 = 0;
                if (0x3e - iVar14 <= iVar15) {
                  iVar15 = iVar14 + iVar15 * 2 + -0x3e;
                  bVar35 = false;
                  iVar23 = 0;
                }
              }
            }
            else {
              iVar20 = (int)(char)decodeChar_decode_chars[local_d8.fminy._0_1_];
              iVar23 = iVar28 * (iVar30 + 1);
              if (iVar23 <= iVar20) {
                iVar15 = (iVar20 - iVar23) / iVar30 + iVar28;
              }
              else {
                iVar15 = iVar20 / (iVar30 + 1);
              }
              bVar35 = iVar23 <= iVar20 && ((uVar29 ^ 0x16) == 0 && iVar30 == 1);
              iVar23 = 0;
            }
            if ((bVar35) && ((TERRITORY_BOUNDARIES[iVar15 + iVar16].flags & 0x400) == 0)) {
              uVar2 = *(undefined1 *)((long)&local_d8.fminy + (ulong)(iVar11 - 4));
              *(undefined1 *)((long)&local_d8.fminy + (ulong)(iVar11 - 4)) =
                   *(undefined1 *)((long)&local_d8.fminy + (ulong)(iVar11 - 3));
              *(undefined1 *)((long)&local_d8.fminy + (ulong)(iVar11 - 3)) = uVar2;
            }
            if (0x1f < iVar14 || uVar29 == 0x15) {
              if ((uVar29 != 0x15) && (iVar14 < 0x3e)) {
                iVar23 = 0;
                pbVar25 = (byte *)((long)&local_d8.fminy + 1);
                while( true ) {
                  bVar3 = *pbVar25;
                  if ((bVar3 == 0) || (bVar3 == 0x2e)) break;
                  iVar23 = (int)(char)decodeChar_decode_chars[bVar3] + iVar23 * 0x1f;
                  pbVar25 = pbVar25 + 1;
                }
                if ((0x3e - iVar14 <= iVar15) && (0x745ef < iVar23)) {
                  iVar23 = iVar23 + -0x745f0;
                  iVar15 = iVar15 + 1;
                }
              }
            }
            else {
              iVar23 = 0;
              pMVar24 = &local_d8;
              while( true ) {
                bVar3 = *(byte *)&pMVar24->fminy;
                if ((bVar3 == 0) || (bVar3 == 0x2e)) break;
                pMVar24 = (MapcodeZone *)((long)&pMVar24->fminy + 1);
                iVar23 = (int)(char)decodeChar_decode_chars[bVar3] + iVar23 * 0x1f;
              }
              if (0 < iVar15) {
                if (iVar15 < iVar28) {
                  iVar28 = iVar15;
                }
                iVar23 = iVar23 + (iVar28 + iVar30 * iVar15) * -0xe1781;
              }
            }
            iVar15 = iVar15 + iVar16;
            iVar11 = TERRITORY_BOUNDARIES[iVar15].flags >> 0x10;
            if (((uint)TERRITORY_BOUNDARIES[iVar15].flags >> 10 & 1) == 0) {
              iVar28 = iVar23 / iVar11;
              iVar23 = iVar23 % iVar11;
            }
            else {
              iVar16 = TERRITORY_BOUNDARIES[iVar15].maxy - TERRITORY_BOUNDARIES[iVar15].miny;
              iVar28 = iVar16 >> 0x1f;
              iVar14 = -iVar28;
              iVar28 = iVar16 / 0x5a + iVar28;
              iVar30 = iVar28 + iVar14 + 1;
              iVar11 = (int)((long)(ulong)(uint)(iVar11 * iVar11) / (long)iVar30);
              iVar14 = iVar23 / (((iVar28 + iVar14) * 2 + 2) * 3);
              iVar28 = (iVar11 + -4) / 6;
              iVar16 = iVar28;
              if (iVar14 < iVar28) {
                iVar16 = iVar14;
              }
              iVar20 = iVar11 + iVar28 * -6;
              if (iVar14 < iVar28) {
                iVar20 = 6;
              }
              iVar28 = iVar23 + iVar30 * iVar16 * -6;
              iVar23 = iVar28 / iVar20;
              iVar28 = iVar28 % iVar20 + iVar16 * 6;
            }
            MVar7 = ERR_MAPCODE_UNDECODABLE;
            if (iVar28 < iVar11) {
              uVar5 = TERRITORY_BOUNDARIES[iVar15].miny;
              iVar11 = TERRITORY_BOUNDARIES[iVar15].maxy;
              uVar12 = uVar5;
              if ((int)uVar5 < 0) {
                iVar16 = 0x168;
                if (iVar11 < 0) {
                  uVar12 = -iVar11;
                  goto LAB_001cf7b9;
                }
              }
              else {
LAB_001cf7b9:
                iVar16 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar12 >> 0x13) * 4);
              }
              iVar28 = iVar28 * iVar16;
              iVar14 = iVar28 + 3;
              if (-1 < iVar28) {
                iVar14 = iVar28;
              }
              (dec->coord32).lonMicroDeg = (iVar14 >> 2) + TERRITORY_BOUNDARIES[iVar15].minx;
              (dec->coord32).latMicroDeg = iVar11 + iVar23 * -0x5a;
              MVar7 = decodeExtension(dec,iVar16,-0x5a,iVar28 % 4,uVar5,
                                      TERRITORY_BOUNDARIES[iVar15].maxx);
            }
          }
LAB_001cf81e:
          bVar35 = true;
        }
        else {
          bVar35 = false;
        }
      }
LAB_001cf823:
      if (bVar35) break;
      lVar34 = lVar34 + 1;
      local_80 = local_80 + 1;
      local_e8 = local_e8 + 1;
      piVar31 = piVar31 + 5;
    } while ((int)local_38 != (int)lVar34);
  }
  if (MVar7 == ERR_OK) {
    restrictZoneTo(&dec->zone,&dec->zone,TERRITORY_BOUNDARIES + (int)local_98);
    MVar7 = ERR_MAPCODE_UNDECODABLE;
    if ((dec->zone).fminx < (dec->zone).fmaxx) {
      MVar7 = ERR_MAPCODE_UNDECODABLE;
      if ((dec->zone).fminy < (dec->zone).fmaxy) {
        MVar7 = ERR_OK;
      }
    }
  }
  pPVar1 = &dec->result;
  if (MVar7 == ERR_OK) {
    dVar38 = (dec->zone).fminy;
    dVar37 = floor(((dec->zone).fminx + (dec->zone).fmaxx) * 0.5);
    dVar38 = floor((dVar38 + (dec->zone).fmaxy) * 0.5);
    dVar37 = dVar37 / 3240000000000.0;
    (dec->result).lat = dVar38 / 810000000000.0;
    (dec->result).lon = dVar37;
    if (dVar38 / 810000000000.0 < -90.0) {
      pPVar1->lat = -90.0;
    }
    if (90.0 < pPVar1->lat) {
      pPVar1->lat = 90.0;
    }
    if (dVar37 < -180.0) {
      (dec->result).lon = dVar37 + 360.0;
    }
    dVar38 = (dec->result).lon;
    if (180.0 <= dVar38) {
      (dec->result).lon = dVar38 + -360.0;
    }
    MVar7 = ERR_OK;
    if ((char)local_ac == '\0') {
      MVar7 = ERR_OK;
      repackIfAllDigits(__s,0);
    }
  }
  else {
    pPVar1->lat = 0.0;
    (dec->result).lon = 0.0;
  }
  return MVar7;
}

Assistant:

static enum MapcodeError decoderEngine(DecodeRec *dec, int parseFlags) {
    enum Territory ccode;
    enum MapcodeError err;
    int codex;
    int from;
    int upto;
    int i;
    char *s;
    int wasAllDigits = 0;
    ASSERT(dec);

    err = parseMapcodeString(&dec->mapcodeElements, dec->orginput, parseFlags, dec->context);
    if (err) { // clear all parsed fields in case of error
        dec->mapcodeElements.territoryISO[0] = 0;
        dec->mapcodeElements.properMapcode[0] = 0;
        dec->mapcodeElements.precisionExtension[0] = 0;
        return err;
    }

    ccode = dec->mapcodeElements.territoryCode;
    dec->context = ccode;
    dec->mapcode = dec->mapcodeElements.properMapcode;
    dec->extension = dec->mapcodeElements.precisionExtension;
    codex = dec->mapcodeElements.indexOfDot * 9 + (int) strlen(dec->mapcodeElements.properMapcode) - 1;
    s = dec->mapcodeElements.properMapcode;

    if (strchr(s, 'A') || strchr(s, 'E') || strchr(s, 'U')) {
        if (unpackIfAllDigits(s) <= 0) {
            return ERR_INVALID_VOWEL;
        }
        wasAllDigits = 1;
    }

    if (codex > 54) {
        ASSERT(codex == 55);
        return ERR_MAPCODE_UNDECODABLE;
    } else if (codex == 54) {
        // international mapcodes must be in international context
        ccode = TERRITORY_AAA;
    } else if (ccode < _TERRITORY_MIN) {
        return ERR_MISSING_TERRITORY;
    } else if (isSubdivision(ccode)) {
        // int mapcodes must be interpreted in the parent of a subdivision
        enum Territory parent = parentTerritoryOf(ccode);
        if ((codex == 44) || ((codex == 34 || codex == 43) && (parent == TERRITORY_IND || parent == TERRITORY_MEX))) {
            ccode = parent;
        }
    }

    from = firstRec(ccode);
    upto = lastRec(ccode);

    // try all ccode rectangles to decode s (pointing to first character of proper mapcode), assume not decodable
    err = ERR_MAPCODE_UNDECODABLE;
    for (i = from; i <= upto; i++) {
        const int codexi = coDex(i);
        const int r = REC_TYPE(i);
        if (r == 0) {
            if (IS_NAMELESS(i)) {
                if (((codexi == 21) && (codex == 22)) ||
                    ((codexi == 22) && (codex == 32)) ||
                    ((codexi == 13) && (codex == 23))) {
                    err = decodeNameless(dec, i);
                    break;
                }
            } else {
                if ((codexi == codex) || ((codex == 22) && (codexi == 21))) {
                    err = decodeGrid(dec, i, 0);

                    // first of all, make sure the zone fits the country
                    restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(upto));

                    if ((err == ERR_OK) && IS_RESTRICTED(i)) {
                        int nrZoneOverlaps = 0;
                        int j;

                        // *** make sure decode fits somewhere ***
                        dec->result = getMidPointFractions(&dec->zone);
                        dec->coord32 = convertFractionsToCoord32(&dec->result);
                        for (j = i - 1; j >= from; j--) { // look in previous rects
                            if (!IS_RESTRICTED(j)) {
                                if (fitsInsideBoundaries(&dec->coord32, TERRITORY_BOUNDARY(j))) {
                                    nrZoneOverlaps = 1;
                                    break;
                                }
                            }
                        }

                        if (!nrZoneOverlaps) {
                            MapcodeZone zfound;
                            TerritoryBoundary prevu;
                            for (j = from; j < i; j++) { // try all smaller rectangles j
                                if (!IS_RESTRICTED(j)) {
                                    MapcodeZone z;
                                    if (restrictZoneTo(&z, &dec->zone, TERRITORY_BOUNDARY(j))) {
                                        nrZoneOverlaps++;
                                        if (nrZoneOverlaps == 1) {
                                            // first fit! remember...
                                            zoneCopyFrom(&zfound, &z);
                                            ASSERT(j <= MAPCODE_BOUNDARY_MAX);
                                            memcpy(&prevu, TERRITORY_BOUNDARY(j), sizeof(TerritoryBoundary));
                                        } else { // nrZoneOverlaps >= 2
                                            // more than one hit
                                            break; // give up
                                        }
                                    }
                                } // IS_RESTRICTED
                            } // for j

                            // if several sub-areas intersect, just return the whole zone
                            // (the center of which may NOT re-encode to the same mapcode!)
                            if (nrZoneOverlaps == 1) { // found exactly ONE intersection?
                                zoneCopyFrom(&dec->zone, &zfound);
                            }
                        }

                        if (!nrZoneOverlaps) {
                            err = ERR_MAPCODE_UNDECODABLE; // type 3 "NLD L222.222"
                        }
                    }  // *** make sure decode fits somewhere ***
                    break;
                }
            }
        } else if (r == 1) {
            if (codex == codexi + 10 && HEADER_LETTER(i) == *s) {
                err = decodeGrid(dec, i, 1);
                break;
            }
        } else { //r>1
            if (((codex == 23) && (codexi == 22)) ||
                ((codex == 33) && (codexi == 23))) {
                err = decodeAutoHeader(dec, i);
                break;
            }
        }
    } // for

    if (!err) {
        restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(lastRec(ccode)));

        if (isEmpty(&dec->zone)) {
            err = ERR_MAPCODE_UNDECODABLE; // type 0 "BRA xx.xx"
        }
    }

    if (err) {
        dec->result.lat = dec->result.lon = 0;
        return err;
    }

    dec->result = getMidPointFractions(&dec->zone);
    dec->result = convertFractionsToDegrees(&dec->result);

    // normalise between =180 and 180
    if (dec->result.lat < -90.0) {
        dec->result.lat = -90.0;
    }
    if (dec->result.lat > 90.0) {
        dec->result.lat = 90.0;
    }
    if (dec->result.lon < -180.0) {
        dec->result.lon += 360.0;
    }
    if (dec->result.lon >= 180.0) {
        dec->result.lon -= 360.0;
    }

    if (wasAllDigits) {
        repackIfAllDigits(dec->mapcodeElements.properMapcode, 0);
    }
    return ERR_OK;
}